

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can.c
# Opt level: O0

int csp_can1_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  long in_RDX;
  ushort in_SI;
  short *in_RDI;
  csp_can_driver_tx_t tx_func;
  uint16_t tx_count;
  uint16_t csp_length_be;
  uint8_t frame_buf [8];
  uint8_t data_bytes;
  uint32_t can_id;
  uint8_t dest;
  uint32_t ident;
  csp_can_interface_data_t *ifdata;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint local_68;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  csp_iface_t *in_stack_ffffffffffffffa8;
  code *pcVar4;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  undefined4 local_45;
  __uint16_t local_41;
  undefined1 auStack_3f [2];
  byte local_3d;
  uint local_3c;
  byte local_35;
  uint local_34;
  uint *local_30;
  long local_20;
  short *local_10;
  int local_4;
  
  if (*(short *)(in_RDX + 0x30) == *in_RDI) {
    csp_qfifo_write((csp_packet_t *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffa8,
                    (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    local_4 = 0;
  }
  else {
    local_30 = *(uint **)(in_RDI + 8);
    local_34 = *local_30;
    *local_30 = local_34 + 1;
    if (in_SI == 0xffff) {
      uVar2 = (uint)*(ushort *)(in_RDX + 0x30);
    }
    else {
      uVar2 = (uint)in_SI;
    }
    local_35 = (byte)uVar2;
    local_3d = 0;
    local_3c = (*(ushort *)(in_RDX + 0x2e) & 0x1f) << 0x18 | (uVar2 & 0x1f) << 0x13 |
               local_34 & 0x3ff | ((*(ushort *)(in_RDX + 0x2a) + 5) / 8 & 0xff) << 10;
    local_20 = in_RDX;
    local_10 = in_RDI;
    csp_id_prepend((csp_packet_t *)0x112fb0);
    local_45 = **(undefined4 **)(local_20 + 0x20);
    local_41 = __bswap_16(*(__uint16_t *)(local_20 + 0x2a));
    if (*(ushort *)(local_20 + 0x2a) < 3) {
      local_3d = (byte)*(undefined2 *)(local_20 + 0x2a);
    }
    else {
      local_3d = 2;
    }
    memcpy(auStack_3f,(void *)(local_20 + 0x48),(ulong)local_3d);
    uVar1 = (ushort)local_3d;
    pcVar4 = *(code **)(local_30 + 2);
    iVar3 = (*pcVar4)(*(undefined8 *)(local_10 + 0xc),local_3c,&local_45,local_3d + 6);
    if (iVar3 == 0) {
      do {
        if (*(ushort *)(local_20 + 0x2a) <= uVar1) {
          csp_buffer_free((void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          return 0;
        }
        if ((int)((uint)*(ushort *)(local_20 + 0x2a) - (uint)uVar1) < 8) {
          local_68 = (uint)*(ushort *)(local_20 + 0x2a) - (uint)uVar1;
        }
        else {
          local_68 = 8;
        }
        local_3d = (byte)local_68;
        in_stack_ffffffffffffff94 =
             (*(ushort *)(local_20 + 0x2e) & 0x1f) << 0x18 | (local_35 & 0x1f) << 0x13 |
             local_34 & 0x3ff | 0x40000;
        local_3c = in_stack_ffffffffffffff94 |
                   ((int)((((uint)*(ushort *)(local_20 + 0x2a) - (uint)uVar1) - (local_68 & 0xff)) +
                         7) / 8 & 0xffU) << 10;
        uVar1 = uVar1 + local_3d;
        iVar3 = (*pcVar4)(*(undefined8 *)(local_10 + 0xc),local_3c,
                          (local_20 + 0x48 + (long)(int)(uint)uVar1) - (long)(int)(local_68 & 0xff),
                          local_3d);
      } while (iVar3 == 0);
      *(int *)(local_10 + 0x1a) = *(int *)(local_10 + 0x1a) + 1;
      local_4 = -0xb;
    }
    else {
      *(int *)(local_10 + 0x1a) = *(int *)(local_10 + 0x1a) + 1;
      local_4 = -0xb;
    }
  }
  return local_4;
}

Assistant:

int csp_can1_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	/* Loopback */
	if (packet->id.dst == iface->addr) {
		csp_qfifo_write(packet, iface, NULL);
		return CSP_ERR_NONE;
	}

	csp_can_interface_data_t * ifdata = iface->interface_data;

	/* Get an unique CFP id - this should be locked to prevent access from multiple tasks */
	const uint32_t ident = ifdata->cfp_packet_counter++;

	/* Figure out destination node based on routing entry */
	const uint8_t dest = (via != CSP_NO_VIA_ADDRESS) ? via : packet->id.dst;

	uint32_t can_id = 0;
	uint8_t data_bytes = 0;
	uint8_t frame_buf[CAN_FRAME_SIZE];

	/**
	 * CSP 1.x Frame Header:
	 * Data offset is always 6.
	 */
	can_id = (CFP_MAKE_SRC(packet->id.src) |
			  CFP_MAKE_DST(dest) |
			  CFP_MAKE_ID(ident) |
			  CFP_MAKE_TYPE(CFP_BEGIN) |
			  CFP_MAKE_REMAIN((packet->length + CFP1_DATA_OFFSET - 1) / CAN_FRAME_SIZE));

	/**
	 * CSP 1.x Data field
	 *
	 * 4 byte CSP 1.0 header
	 * 2 byte length field
	 * 2 byte data (optional)
	 */

	/* Copy CSP 1.x headers and data: Always 4 bytes */
	csp_id_prepend(packet);
	memcpy(frame_buf + CFP1_CSP_HEADER_OFFSET, packet->frame_begin, CFP1_CSP_HEADER_SIZE);

	/* Copy length field, always 2 bytes */
	uint16_t csp_length_be = htobe16(packet->length);
	memcpy(frame_buf + CFP1_DATA_LEN_OFFSET, &csp_length_be, CFP1_DATA_LEN_SIZE);

	/* Calculate number of data bytes. Max 2 bytes possible */
	data_bytes = (packet->length <= CFP1_DATA_SIZE_BEGIN) ? packet->length : CFP1_DATA_SIZE_BEGIN;
	memcpy(frame_buf + CFP1_DATA_OFFSET, packet->data, data_bytes);

	/* Increment tx counter */
	uint16_t tx_count = data_bytes;

	const csp_can_driver_tx_t tx_func = ifdata->tx_func;

	/* Send first frame */
	if ((tx_func)(iface->driver_data, can_id, frame_buf, CFP1_DATA_OFFSET + data_bytes) != CSP_ERR_NONE) {
		iface->tx_error++;
		/* Does not free on return */
		return CSP_ERR_DRIVER;
	}

	/* Send next frames if not complete */
	while (tx_count < packet->length) {

		/**
		 * CSP 1.x Frame Header:
		 * Data offset is always 6.
		 */

		/* Calculate frame data bytes */
		data_bytes = (packet->length - tx_count >= CAN_FRAME_SIZE) ? CAN_FRAME_SIZE : packet->length - tx_count;

		/* Prepare identifier */
		can_id = (CFP_MAKE_SRC(packet->id.src) |
				  CFP_MAKE_DST(dest) |
				  CFP_MAKE_ID(ident) |
				  CFP_MAKE_TYPE(CFP_MORE) |
				  CFP_MAKE_REMAIN((packet->length - tx_count - data_bytes + CAN_FRAME_SIZE - 1) / CAN_FRAME_SIZE));

		/* Increment tx counter */
		tx_count += data_bytes;

		/* Send frame */
		if ((tx_func)(iface->driver_data, can_id, packet->data + tx_count - data_bytes, data_bytes) != CSP_ERR_NONE) {
			iface->tx_error++;
			/* Does not free on return */
			return CSP_ERR_DRIVER;
		}
	}

	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}